

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O0

char * trimWhitespace(char *str)

{
  ushort **ppuVar1;
  size_t sVar2;
  char *in_RDI;
  int i;
  int local_14;
  char *local_10;
  char *local_8;
  
  local_10 = in_RDI;
  local_8 = in_RDI;
  if (in_RDI != (char *)0x0) {
    while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*local_10] & 0x2000) != 0) {
      local_10 = local_10 + 1;
    }
    if (*local_10 == '\0') {
      local_8 = local_10;
    }
    else {
      sVar2 = strlen(local_10);
      local_14 = (int)sVar2;
      while (local_14 = local_14 + -1, -1 < local_14) {
        ppuVar1 = __ctype_b_loc();
        if (((*ppuVar1)[(int)local_10[local_14]] & 0x2000) == 0) {
          return local_10;
        }
        local_10[local_14] = '\0';
      }
      local_8 = local_10;
    }
  }
  return local_8;
}

Assistant:

static char *trimWhitespace( char *str )
{
   int i;

   if( !str ) return str;

   while( isspace(*str) ) str++;
   if( *str == '\0' ) return str;

   for( i=(int)strlen(str)-1; i >= 0; i-- )
   {
      if( !isspace(str[i]) )
         return str;
      str[i] = '\0';
   }

   return str;
}